

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandICut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nInputs;
  Abc_Ntk_t *pNtk;
  int iVar2;
  char *format;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  nInputs = 5;
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Kh");
    iVar2 = globalUtilOptind;
    if (iVar1 != 0x4b) {
      if (iVar1 == -1) {
        if (pNtk == (Abc_Ntk_t *)0x0) {
          format = "Empty network.\n";
        }
        else {
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            Abc_NtkIvyCuts(pNtk,nInputs);
            return 0;
          }
          format = "This command works only for strashed networks.\n";
        }
        iVar2 = -1;
        goto LAB_0022e608;
      }
      goto LAB_0022e5ca;
    }
    if (argc <= globalUtilOptind) break;
    nInputs = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nInputs < 0) {
LAB_0022e5ca:
      iVar2 = -2;
      Abc_Print(-2,"usage: icut [-K num] [-h]\n");
      Abc_Print(-2,"\t         computes sequential cuts of the given size\n");
      Abc_Print(-2,"\t-K num : the number of cut inputs (2 <= num <= 6) [default = %d]\n",
                (ulong)nInputs);
      format = "\t-h     : print the command usage\n";
LAB_0022e608:
      Abc_Print(iVar2,format);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
  goto LAB_0022e5ca;
}

Assistant:

int Abc_CommandICut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, nInputs;
    extern void Abc_NtkIvyCuts( Abc_Ntk_t * pNtk, int nInputs );

    // set defaults
    nInputs = 5;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Kh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nInputs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInputs < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    Abc_NtkIvyCuts( pNtk, nInputs );
    return 0;

usage:
    Abc_Print( -2, "usage: icut [-K num] [-h]\n" );
    Abc_Print( -2, "\t         computes sequential cuts of the given size\n" );
    Abc_Print( -2, "\t-K num : the number of cut inputs (2 <= num <= 6) [default = %d]\n", nInputs );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}